

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_fsgldiv_m68k(CPUM68KState_conflict *env,FPReg_conflict *res,FPReg_conflict *val0,
                        FPReg_conflict *val1)

{
  int val;
  int val_00;
  floatx80 fVar1;
  floatx80 fVar2;
  floatx80 a_00;
  floatx80 b_00;
  undefined6 uStack_7e;
  int old;
  floatx80 b;
  floatx80 a;
  int rounding_mode;
  FPReg_conflict *val1_local;
  FPReg_conflict *val0_local;
  FPReg_conflict *res_local;
  CPUM68KState_conflict *env_local;
  
  val = get_float_rounding_mode(&env->fp_status);
  val_00 = get_floatx80_rounding_precision(&env->fp_status);
  set_floatx80_rounding_precision(0x20,&env->fp_status);
  set_float_rounding_mode(3,&env->fp_status);
  fVar1._10_6_ = 0;
  fVar1._0_10_ = *(unkuint10 *)val1;
  fVar1 = floatx80_round_m68k(fVar1,&env->fp_status);
  fVar2._10_6_ = 0;
  fVar2._0_10_ = *(unkuint10 *)val0;
  fVar2 = floatx80_round_m68k(fVar2,&env->fp_status);
  set_float_rounding_mode(val,&env->fp_status);
  a_00._10_6_ = 0;
  a_00.low = (long)fVar1._0_10_;
  a_00.high = (short)(fVar1._0_10_ >> 0x40);
  b_00._10_6_ = 0;
  b_00.low = (long)fVar2._0_10_;
  b_00.high = (short)(fVar2._0_10_ >> 0x40);
  fVar1 = floatx80_div_m68k(a_00,b_00,&env->fp_status);
  (res->d).low = fVar1.low;
  *(ulong *)&(res->d).high = CONCAT62(uStack_7e,fVar1.high);
  set_floatx80_rounding_precision(val_00,&env->fp_status);
  return;
}

Assistant:

void HELPER(fsgldiv)(CPUM68KState *env, FPReg *res, FPReg *val0, FPReg *val1)
{
    int rounding_mode = get_float_rounding_mode(&env->fp_status);
    floatx80 a, b;

    PREC_BEGIN(32);
    set_float_rounding_mode(float_round_to_zero, &env->fp_status);
    a = floatx80_round(val1->d, &env->fp_status);
    b = floatx80_round(val0->d, &env->fp_status);
    set_float_rounding_mode(rounding_mode, &env->fp_status);
    res->d = floatx80_div(a, b, &env->fp_status);
    PREC_END();
}